

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polygon_layer.cc
# Opt level: O0

void __thiscall
s2builderutil::S2PolygonLayer::AppendEdgeLabels
          (S2PolygonLayer *this,Graph *g,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *edge_loops)

{
  pointer this_00;
  bool bVar1;
  EdgeType edge_type;
  size_type __n;
  reference piVar2;
  int32 local_c8;
  EdgeId local_c4;
  const_iterator cStack_c0;
  int edge_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> loop_label_set_ids;
  vector<int,_std::allocator<int>_> *edge_loop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  undefined1 local_60 [8];
  LabelFetcher fetcher;
  vector<int,_std::allocator<int>_> labels;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *edge_loops_local;
  Graph *g_local;
  S2PolygonLayer *this_local;
  
  if (this->label_set_ids_ != (LabelSetIds *)0x0) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &fetcher.sibling_map_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    edge_type = Options::edge_type(&this->options_);
    S2Builder::Graph::LabelFetcher::LabelFetcher((LabelFetcher *)local_60,g,edge_type);
    __end1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::begin(edge_loops);
    edge_loop = (vector<int,_std::allocator<int>_> *)
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::end(edge_loops);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                       *)&edge_loop), bVar1) {
      loop_label_set_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator*(&__end1);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2)
      ;
      __n = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       loop_label_set_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&__range2,__n);
      this_00 = loop_label_set_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      __end2 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)
                          loop_label_set_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      cStack_c0 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)this_00);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff40), bVar1) {
        piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        local_c4 = *piVar2;
        S2Builder::Graph::LabelFetcher::Fetch
                  ((LabelFetcher *)local_60,local_c4,
                   (vector<int,_std::allocator<int>_> *)
                   &fetcher.sibling_map_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        local_c8 = IdSetLexicon::Add<std::vector<int,std::allocator<int>>>
                             (this->label_set_lexicon_,
                              (vector<int,_std::allocator<int>_> *)
                              &fetcher.sibling_map_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&__range2,&local_c8);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(this->label_set_ids_,(value_type *)&__range2);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range2);
      __gnu_cxx::
      __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&__end1);
    }
    S2Builder::Graph::LabelFetcher::~LabelFetcher((LabelFetcher *)local_60);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &fetcher.sibling_map_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void S2PolygonLayer::AppendEdgeLabels(
    const Graph& g,
    const vector<Graph::EdgeLoop>& edge_loops) {
  if (!label_set_ids_) return;

  vector<Label> labels;  // Temporary storage for labels.
  Graph::LabelFetcher fetcher(g, options_.edge_type());
  for (const auto& edge_loop : edge_loops) {
    vector<LabelSetId> loop_label_set_ids;
    loop_label_set_ids.reserve(edge_loop.size());
    for (auto edge_id : edge_loop) {
      fetcher.Fetch(edge_id, &labels);
      loop_label_set_ids.push_back(label_set_lexicon_->Add(labels));
    }
    label_set_ids_->push_back(std::move(loop_label_set_ids));
  }
}